

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathMatrix3.cpp
# Opt level: O0

Real __thiscall COLLADABU::Math::Matrix3::spectralNorm(Matrix3 *this)

{
  double dVar1;
  Real *pRVar2;
  long in_RDI;
  Real RVar3;
  double dVar4;
  Real fNorm;
  Real fRoot;
  Real afCoeff [3];
  Real fInvPmax;
  int iMid;
  Real fPmax;
  size_t iCol;
  size_t iRow;
  Matrix3 kP;
  int local_6c;
  double local_68;
  ulong local_60;
  ulong local_58;
  Matrix3 local_50;
  
  Matrix3(&local_50);
  local_68 = 0.0;
  for (local_58 = 0; local_58 < 3; local_58 = local_58 + 1) {
    for (local_60 = 0; local_60 < 3; local_60 = local_60 + 1) {
      pRVar2 = operator[](&local_50,local_58);
      pRVar2[local_60] = 0.0;
      for (local_6c = 0; local_6c < 3; local_6c = local_6c + 1) {
        dVar4 = *(double *)(in_RDI + (long)local_6c * 0x18 + local_58 * 8);
        dVar1 = *(double *)(in_RDI + (long)local_6c * 0x18 + local_60 * 8);
        pRVar2 = operator[](&local_50,local_58);
        pRVar2[local_60] = dVar4 * dVar1 + pRVar2[local_60];
      }
      pRVar2 = operator[](&local_50,local_58);
      if (local_68 < pRVar2[local_60]) {
        pRVar2 = operator[](&local_50,local_58);
        local_68 = pRVar2[local_60];
      }
    }
  }
  for (local_58 = 0; local_58 < 3; local_58 = local_58 + 1) {
    for (local_60 = 0; local_60 < 3; local_60 = local_60 + 1) {
      pRVar2 = operator[](&local_50,local_58);
      pRVar2[local_60] = (1.0 / local_68) * pRVar2[local_60];
    }
  }
  pRVar2 = operator[](&local_50,0);
  pRVar2 = (Real *)*pRVar2;
  operator[](&local_50,1);
  operator[](&local_50,2);
  operator[](&local_50,1);
  operator[](&local_50,2);
  operator[](&local_50,0);
  operator[](&local_50,2);
  operator[](&local_50,1);
  operator[](&local_50,1);
  operator[](&local_50,2);
  operator[](&local_50,0);
  operator[](&local_50,1);
  operator[](&local_50,2);
  operator[](&local_50,2);
  operator[](&local_50,1);
  operator[](&local_50,0);
  operator[](&local_50,1);
  operator[](&local_50,0);
  operator[](&local_50,1);
  operator[](&local_50,0);
  operator[](&local_50,2);
  operator[](&local_50,0);
  operator[](&local_50,2);
  operator[](&local_50,1);
  operator[](&local_50,2);
  operator[](&local_50,1);
  operator[](&local_50,2);
  operator[](&local_50,0);
  operator[](&local_50,1);
  operator[](&local_50,2);
  RVar3 = maxCubicRoot(pRVar2);
  dVar4 = sqrt(local_68 * RVar3);
  return dVar4;
}

Assistant:

Real Matrix3::spectralNorm () const
        {
            Matrix3 kP;
            size_t iRow, iCol;
            Real fPmax = 0.0;

            for ( iRow = 0; iRow < 3; iRow++ )
            {
                for ( iCol = 0; iCol < 3; iCol++ )
                {
                    kP[ iRow ][ iCol ] = 0.0;

                    for ( int iMid = 0; iMid < 3; iMid++ )
                    {
                        kP[ iRow ][ iCol ] +=
                            m[ iMid ][ iRow ] * m[ iMid ][ iCol ];
                    }

                    if ( kP[ iRow ][ iCol ] > fPmax )
                        fPmax = kP[ iRow ][ iCol ];
                }
            }

            Real fInvPmax = 1.0 / fPmax;

            for ( iRow = 0; iRow < 3; iRow++ )
            {
                for ( iCol = 0; iCol < 3; iCol++ )
                    kP[ iRow ][ iCol ] *= fInvPmax;
            }

            Real afCoeff[ 3 ];
            afCoeff[ 0 ] = -( kP[ 0 ][ 0 ] * ( kP[ 1 ][ 1 ] * kP[ 2 ][ 2 ] - kP[ 1 ][ 2 ] * kP[ 2 ][ 1 ] ) +
                              kP[ 0 ][ 1 ] * ( kP[ 2 ][ 0 ] * kP[ 1 ][ 2 ] - kP[ 1 ][ 0 ] * kP[ 2 ][ 2 ] ) +
                              kP[ 0 ][ 2 ] * ( kP[ 1 ][ 0 ] * kP[ 2 ][ 1 ] - kP[ 2 ][ 0 ] * kP[ 1 ][ 1 ] ) );
            afCoeff[ 1 ] = kP[ 0 ][ 0 ] * kP[ 1 ][ 1 ] - kP[ 0 ][ 1 ] * kP[ 1 ][ 0 ] +
                           kP[ 0 ][ 0 ] * kP[ 2 ][ 2 ] - kP[ 0 ][ 2 ] * kP[ 2 ][ 0 ] +
                           kP[ 1 ][ 1 ] * kP[ 2 ][ 2 ] - kP[ 1 ][ 2 ] * kP[ 2 ][ 1 ];
            afCoeff[ 2 ] = -( kP[ 0 ][ 0 ] + kP[ 1 ][ 1 ] + kP[ 2 ][ 2 ] );

            Real fRoot = maxCubicRoot( afCoeff );
            Real fNorm = sqrt( fPmax * fRoot );
            return fNorm;
        }